

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall
QCss::ValueExtractor::extractBackground
          (ValueExtractor *this,QBrush *brush,QString *image,Repeat *repeat,Alignment *alignment,
          Origin *origin,Attachment *attachment,Origin *clip)

{
  QPalette *pal;
  QPalette *pal_00;
  __atomic_base<int> _Var1;
  Property PVar2;
  Declaration *pDVar3;
  DeclarationData *pDVar4;
  _Head_base<0UL,_QBrushData_*,_false> _Var5;
  __uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter> _Var6;
  char16_t *pcVar7;
  QArrayData *pQVar8;
  QPalettePrivate *pQVar9;
  undefined1 auVar10 [8];
  Alignment AVar11;
  Attachment AVar12;
  int iVar13;
  QFlagsStorage<Qt::AlignmentFlag> QVar14;
  quint64 qVar15;
  Attachment *pAVar16;
  int iVar17;
  QBrush *this_00;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  BackgroundData data;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 local_68 [16];
  QString local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->declarations).d.size == 0) {
    bVar20 = false;
  }
  else {
    uVar19 = 0;
    bVar20 = false;
    do {
      pDVar3 = (this->declarations).d.ptr;
      pDVar4 = pDVar3[uVar19].d.d.ptr;
      if ((pDVar4->values).d.size == 0) goto LAB_005e8fcb;
      pal = (QPalette *)(pDVar3 + uVar19);
      PVar2 = pDVar4->propertyId;
      if (6 < PVar2 - Background) {
        if (PVar2 == BackgroundColor) {
          QPalette::QPalette((QPalette *)local_68);
          Declaration::brushValue((Declaration *)&local_88.shared,pal);
          _Var5._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
          local_88.shared = (PrivateShared *)_Var5._M_head_impl;
          QBrush::~QBrush((QBrush *)&local_88.shared);
          QPalette::~QPalette((QPalette *)local_68);
          goto LAB_005e8fc8;
        }
        goto LAB_005e8fcb;
      }
      switch(PVar2) {
      case Background:
        if (*(ulong *)&(pDVar4->parsed).d.field_0x18 < 4) {
          local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          uStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_98);
          uStack_90._0_4_ = 0x11;
          uStack_90._4_4_ = 0;
          pQVar9 = pal->d;
          QBrush::QBrush((QBrush *)local_68);
          auVar10 = local_98;
          local_68._8_8_ = (char16_t *)0x11;
          local_98 = (undefined1  [8])local_68._0_8_;
          local_68._0_8_ = auVar10;
          uStack_90 = (char16_t *)0x11;
          QBrush::~QBrush((QBrush *)local_68);
          pQVar8 = &((image->d).d)->super_QArrayData;
          (image->d).d = (Data *)0x0;
          (image->d).ptr = (char16_t *)0x0;
          (image->d).size = 0;
          if (pQVar8 != (QArrayData *)0x0) {
            LOCK();
            (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar8,2,0x10);
            }
          }
          *repeat = Repeat_XY;
          (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
          super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x21;
          if (pQVar9[1].data.d.ptr != (Data *)0x0) {
            lVar18 = 0;
            iVar17 = 0;
            do {
              pal_00 = (QPalette *)(*(long *)&pQVar9[1].detach_no + lVar18 * 0x28);
              if (*(int *)&pal_00->d == 6) {
                iVar13 = ::QVariant::toInt((bool *)&pal_00->currentGroup);
                if (iVar13 != 0x27) goto LAB_005e9292;
                _Var5._M_head_impl = (QBrushData *)(image->d).d;
                (image->d).d = (Data *)0x0;
                (image->d).ptr = (char16_t *)0x0;
                (image->d).size = 0;
                if (_Var5._M_head_impl != (QBrushData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value).
                  super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value).
                       super___atomic_base<int>._M_i + -1;
                  _Var1._M_i = (((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value).
                               super___atomic_base<int>._M_i;
                  UNLOCK();
                  goto joined_r0x005e9278;
                }
              }
              else if (*(int *)&pal_00->d == 7) {
                ::QVariant::toString();
                _Var5._M_head_impl = (QBrushData *)(image->d).d;
                pcVar7 = (image->d).ptr;
                (image->d).d = (Data *)local_68._0_8_;
                (image->d).ptr = (char16_t *)local_68._8_8_;
                pQVar8 = (QArrayData *)(image->d).size;
                (image->d).size = (qsizetype)local_58.d.d;
                local_68._0_8_ = _Var5._M_head_impl;
                local_68._8_8_ = pcVar7;
                local_58.d.d = (Data *)pQVar8;
                if ((tuple<QBrushData_*,_QBrushDataPointerDeleter>)_Var5._M_head_impl !=
                    (_Head_base<0UL,_QBrushData_*,_false>)0x0) {
                  LOCK();
                  ((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value =
                       (Type)((int)((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value + -1);
                  _Var1._M_i = *(__int_type *)
                                &((QBasicAtomicInt *)&(_Var5._M_head_impl)->ref)->_q_value;
                  UNLOCK();
joined_r0x005e9278:
                  if (_Var1._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)_Var5._M_head_impl,2,0x10);
                  }
                }
              }
              else {
LAB_005e9292:
                if ((*(int *)&pal_00->d == 6) &&
                   (iVar13 = ::QVariant::toInt((bool *)&pal_00->currentGroup), iVar13 == 0x28)) {
                  QBrush::QBrush((QBrush *)&local_88.shared,transparent,SolidPattern);
                  QBrush::QBrush((QBrush *)local_68,(QBrush *)&local_88.shared);
                  auVar10 = local_98;
                  local_68._8_8_ = (char16_t *)0x100000011;
                  local_98 = (undefined1  [8])local_68._0_8_;
                  local_68._0_8_ = auVar10;
                  uStack_90 = (char16_t *)0x100000011;
                  QBrush::~QBrush((QBrush *)local_68);
                  QBrush::~QBrush((QBrush *)&local_88.shared);
                }
                ::QVariant::toString();
                qVar15 = findKnownValue((QString *)local_68,repeats,5);
                if ((_Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>)local_68._0_8_ !=
                    (QBrushData *)0x0) {
                  LOCK();
                  *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
                  UNLOCK();
                  if (*(int *)local_68._0_8_ == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                  }
                }
                if ((Repeat)qVar15 == Repeat_Unknown) {
                  if (*(int *)&pal_00->d == 6) {
                    iVar13 = 1;
                    if (lVar18 < (long)&pQVar9[1].data.d.ptr[-1].field_0x21f) {
                      bVar20 = *(int *)(*(long *)&pQVar9[1].detach_no + (long)(iVar17 + 1) * 0x28)
                               == 6;
                      iVar13 = iVar17 + 1;
                      if (!bVar20) {
                        iVar13 = iVar17;
                      }
                      iVar17 = iVar13;
                      iVar13 = bVar20 + 1;
                    }
                    QVar14.i = (Int)parseAlignment((Value *)(lVar18 * 0x28 +
                                                            *(long *)&pQVar9[1].detach_no),iVar13);
                    if ((QFlagsStorage<Qt::AlignmentFlag>)QVar14.i !=
                        (QFlagsStorage<Qt::AlignmentFlag>)0x0) {
                      (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                      super_QFlagsStorage<Qt::AlignmentFlag>.i = QVar14.i;
                      goto LAB_005e9423;
                    }
                    iVar17 = (iVar17 - iVar13) + 1;
                  }
                  parseBrushValue((Value *)local_68,pal_00);
                  auVar10 = local_98;
                  local_98 = (undefined1  [8])local_68._0_8_;
                  uStack_90 = (char16_t *)local_68._8_8_;
                  local_68._0_8_ = auVar10;
                  QBrush::~QBrush((QBrush *)local_68);
                }
                else {
                  *repeat = (Repeat)qVar15;
                }
              }
LAB_005e9423:
              iVar17 = iVar17 + 1;
              lVar18 = (long)iVar17;
            } while (lVar18 < (long)pQVar9[1].data.d.ptr);
          }
          brushFromData((BrushData *)local_68,(QPalette *)local_98);
          _Var5._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_68._0_8_;
          local_68._0_8_ = _Var5._M_head_impl;
          QBrush::~QBrush((QBrush *)local_68);
          if (uStack_90._4_4_ != 3) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QBrush::QBrush((QBrush *)local_68,(QBrush *)local_98);
            local_68._8_8_ = uStack_90;
            local_58.d.d = (image->d).d;
            local_58.d.ptr = (image->d).ptr;
            local_58.d.size = (image->d).size;
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            uStack_40 = (undefined1 *)
                        CONCAT44((alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i,*repeat);
            ::QVariant::QVariant((QVariant *)&local_88,(QMetaType)0x809298,local_68);
            ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_88);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
              UNLOCK();
              if (*(int *)local_58.d.d == 0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            QBrush::~QBrush((QBrush *)local_68);
          }
          this_00 = (QBrush *)local_98;
        }
        else {
          local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          qvariant_cast<QCss::BackgroundData>((BackgroundData *)local_68,(QVariant *)(pal->d + 2));
          brushFromData((BrushData *)&local_88,(QPalette *)local_68);
          _Var5._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
          local_88.shared = (PrivateShared *)_Var5._M_head_impl;
          QBrush::~QBrush((QBrush *)&local_88.shared);
          QString::operator=(image,&local_58);
          *repeat = (Repeat)uStack_40;
          (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
          super_QFlagsStorage<Qt::AlignmentFlag>.i = (Int)uStack_40._4_4_;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
            UNLOCK();
            if (*(int *)local_58.d.d == 0) {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          this_00 = (QBrush *)local_68;
        }
        QBrush::~QBrush(this_00);
        bVar20 = true;
        break;
      case BackgroundOrigin:
        AVar12 = Declaration::originValue((Declaration *)pal);
        pAVar16 = origin;
        goto LAB_005e8fc6;
      case BackgroundClip:
        AVar12 = Declaration::originValue((Declaration *)pal);
        pAVar16 = clip;
        goto LAB_005e8fc6;
      case BackgroundRepeat:
        if (3 < *(ulong *)&(pDVar4->parsed).d.field_0x18) {
          AVar12 = ::QVariant::toInt((bool *)&pDVar4->parsed);
          pAVar16 = repeat;
          goto LAB_005e8fc6;
        }
        ::QVariant::toString();
        qVar15 = findKnownValue((QString *)local_68,repeats,5);
        *repeat = (Repeat)qVar15;
        if ((_Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>)local_68._0_8_ !=
            (QBrushData *)0x0) {
          LOCK();
          *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_68._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        ::QVariant::QVariant((QVariant *)local_68,*repeat);
        ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)local_68);
        ::QVariant::~QVariant((QVariant *)local_68);
        bVar20 = true;
        break;
      case BackgroundPosition:
        AVar11 = Declaration::alignmentValue((Declaration *)pal);
        (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
        super_QFlagsStorage<Qt::AlignmentFlag>.i = (Int)AVar11;
        goto LAB_005e8fc8;
      case BackgroundAttachment:
        AVar12 = Declaration::attachmentValue((Declaration *)pal);
        pAVar16 = attachment;
LAB_005e8fc6:
        *pAVar16 = AVar12;
LAB_005e8fc8:
        bVar20 = true;
        break;
      case BackgroundImage:
        bVar20 = true;
        if (((pDVar4->values).d.ptr)->type == Uri) {
          ::QVariant::toString();
          _Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
               (tuple<QBrushData_*,_QBrushDataPointerDeleter>)(image->d).d;
          pcVar7 = (image->d).ptr;
          (image->d).d = (Data *)local_68._0_8_;
          (image->d).ptr = (char16_t *)local_68._8_8_;
          pQVar8 = (QArrayData *)(image->d).size;
          (image->d).size = (qsizetype)local_58.d.d;
          local_68._0_8_ =
               _Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          local_68._8_8_ = pcVar7;
          local_58.d.d = (Data *)pQVar8;
          if ((__uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>)
              _Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
              super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>)0x0) {
            LOCK();
            *(int *)_Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
                 *(int *)_Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + -1;
            UNLOCK();
            if (*(int *)_Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl == 0) {
              QArrayData::deallocate
                        ((QArrayData *)
                         _Var6._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,2,0x10);
            }
          }
        }
      }
LAB_005e8fcb:
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar20;
}

Assistant:

bool ValueExtractor::extractBackground(QBrush *brush, QString *image, Repeat *repeat,
                                       Qt::Alignment *alignment, Origin *origin, Attachment *attachment,
                                       Origin *clip)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case BackgroundColor:
                    *brush = decl.brushValue();
                break;
            case BackgroundImage:
                if (val.type == Value::Uri)
                    *image = val.variant.toString();
                break;
            case BackgroundRepeat:
                if (decl.d->parsed.isValid()) {
                    *repeat = static_cast<Repeat>(decl.d->parsed.toInt());
                } else {
                    *repeat = static_cast<Repeat>(findKnownValue(val.variant.toString(),
                                                  repeats, NumKnownRepeats));
                    decl.d->parsed = *repeat;
                }
                break;
            case BackgroundPosition:
                *alignment = decl.alignmentValue();
                break;
            case BackgroundOrigin:
                *origin = decl.originValue();
                break;
            case BackgroundClip:
                *clip = decl.originValue();
                break;
            case Background:
                if (decl.d->parsed.isValid()) {
                    BackgroundData data = qvariant_cast<BackgroundData>(decl.d->parsed);
                    *brush = brushFromData(data.brush, pal);
                    *image = data.image;
                    *repeat = data.repeat;
                    *alignment = data.alignment;
                } else {
                    BrushData brushData;
                    parseShorthandBackgroundProperty(decl.d->values, &brushData, image, repeat, alignment, pal);
                    *brush = brushFromData(brushData, pal);
                    if (brushData.type != BrushData::DependsOnThePalette) {
                        BackgroundData data = { brushData, *image, *repeat, *alignment };
                        decl.d->parsed = QVariant::fromValue<BackgroundData>(data);
                    }
                }
                break;
            case BackgroundAttachment:
                *attachment = decl.attachmentValue();
                break;
            default: continue;
        }
        hit = true;
    }
    return hit;
}